

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

EnumInfo * __thiscall
Catch::Detail::EnumValuesRegistry::registerEnum
          (EnumValuesRegistry *this,StringRef enumName,StringRef allValueNames,
          vector<int,_std::allocator<int>_> *values)

{
  StringRef enumName_00;
  StringRef allValueNames_00;
  __uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> local_20;
  
  allValueNames_00.m_size = allValueNames.m_start;
  allValueNames_00.m_start = (char *)enumName.m_size;
  enumName_00.m_size = enumName.m_start;
  enumName_00.m_start = (char *)&local_20;
  makeEnumInfo(enumName_00,allValueNames_00,
               (vector<int,_std::allocator<int>_> *)allValueNames.m_size);
  std::
  vector<std::unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>>,std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>>>>
  ::
  emplace_back<std::unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>>>
            ((vector<std::unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>>,std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>>>>
              *)&this->m_enumInfos,
             (unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> *)
             &local_20);
  if (local_20._M_t.
      super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
      .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>)
      0x0) {
    clara::std::default_delete<Catch::Detail::EnumInfo>::operator()
              ((default_delete<Catch::Detail::EnumInfo> *)&local_20,
               (EnumInfo *)
               local_20._M_t.
               super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
               .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl);
  }
  return (this->m_enumInfos).
         super__Vector_base<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
         .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl;
}

Assistant:

EnumInfo const& EnumValuesRegistry::registerEnum( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            m_enumInfos.push_back(makeEnumInfo(enumName, allValueNames, values));
            return *m_enumInfos.back();
        }